

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting
          (OptionInterpreter *this,UninterpretedOption *uninterpreted_option,Message *options)

{
  int iVar1;
  undefined4 extraout_var;
  FieldDescriptor *field;
  LogMessage *other;
  Message *pMVar2;
  Reflection *this_00;
  LogFinisher local_61;
  LogMessage local_60;
  
  iVar1 = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  local_60._0_8_ = (long)&local_60 + 0x10U;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"uninterpreted_option","");
  field = Descriptor::FindFieldByName
                    ((Descriptor *)CONCAT44(extraout_var,iVar1),(string *)&local_60);
  if (local_60._0_8_ != (long)&local_60 + 0x10U) {
    operator_delete((void *)local_60._0_8_);
  }
  if (field == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x19f3);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: field != nullptr: ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  pMVar2 = Reflection::AddMessage(this_00,options,field,(MessageFactory *)0x0);
  (*(pMVar2->super_MessageLite)._vptr_MessageLite[0x10])(pMVar2,uninterpreted_option);
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting(
    const UninterpretedOption& uninterpreted_option, Message* options) {
  const FieldDescriptor* field =
      options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(field != nullptr);

  options->GetReflection()
      ->AddMessage(options, field)
      ->CopyFrom(uninterpreted_option);
}